

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

HighsInt __thiscall
HighsOrbitopeMatrix::getBranchingColumn
          (HighsOrbitopeMatrix *this,vector<double,_std::allocator<double>_> *colLower,
          vector<double,_std::allocator<double>_> *colUpper,HighsInt col)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  ValueType *pVVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  int local_1c;
  
  local_1c = col;
  pVVar4 = HighsHashTable<int,_int>::find(&this->columnToRow,&local_1c);
  if ((pVVar4 != (ValueType *)0x0) &&
     ((this->rowIsSetPacking).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[*pVVar4] != '\0')) {
    piVar5 = (this->matrix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + *pVVar4;
    uVar6 = 0;
    if (0 < this->rowLength) {
      uVar6 = (ulong)(uint)this->rowLength;
    }
    lVar7 = uVar6 + 1;
    while ((lVar7 = lVar7 + -1, lVar7 != 0 && (iVar3 = *piVar5, iVar3 != local_1c))) {
      piVar5 = piVar5 + this->numRows;
      dVar2 = (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar3];
      pdVar1 = (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start + iVar3;
      if (dVar2 != *pdVar1) {
        return iVar3;
      }
      if (NAN(dVar2) || NAN(*pdVar1)) {
        return iVar3;
      }
    }
  }
  return local_1c;
}

Assistant:

HighsInt HighsOrbitopeMatrix::getBranchingColumn(
    const std::vector<double>& colLower, const std::vector<double>& colUpper,
    HighsInt col) const {
  const HighsInt* i = columnToRow.find(col);
  if (i && rowIsSetPacking[*i]) {
    for (HighsInt j = 0; j < rowLength; ++j) {
      HighsInt branchCol = entry(*i, j);
      if (branchCol == col) break;
      if (colLower[branchCol] != colUpper[branchCol]) return branchCol;
    }
  }

  return col;
}